

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryInt
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,OpCodeAsmJs op)

{
  AsmJsByteCodeWriter *this_00;
  ParseNode *pnode_00;
  ParseNode *this_01;
  AsmJsFunc *pAVar1;
  bool bVar2;
  undefined4 uVar3;
  Types TVar4;
  EmitInfoBase R0;
  ParseNodeBin *pPVar5;
  ParseNodeInt *pPVar6;
  RegisterSpace *pRVar7;
  AsmJsCompilationException *this_02;
  AsmJsRetType local_50;
  undefined4 local_4c;
  EmitExpressionInfo local_48;
  EmitExpressionInfo local_40;
  EmitExpressionInfo local_38;
  
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  pnode_00 = pPVar5->pnode1;
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  this_01 = pPVar5->pnode2;
  if (this_01->nop == knopInt) {
    pPVar6 = ParseNode::AsParseNodeInt(this_01);
    uVar3 = (undefined4)CONCAT71((int7)((ulong)pPVar6 >> 8),pPVar6->lw == 0);
  }
  else {
    uVar3 = 0;
  }
  if (((op == Or_Int) && ((char)uVar3 != '\0')) && (pnode_00->nop == knopCall)) {
    AsmJsRetType::AsmJsRetType(&local_50,Signed);
    local_40 = EmitCall(this,pnode_00,local_50);
    bVar2 = AsmJsType::isIntish(&local_40.type);
    if (bVar2) {
      local_40.type.which_ = Signed;
      return local_40;
    }
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_02,
               L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish");
  }
  else {
    local_4c = uVar3;
    local_48 = Emit(this,pnode_00);
    local_38 = Emit(this,this_01);
    bVar2 = AsmJsType::isIntish(&local_48.type);
    if ((bVar2) && (bVar2 = AsmJsType::isIntish(&local_38.type), bVar2)) {
      pAVar1 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<int>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar4);
      if ((local_48.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar7->mRegisterCount <= local_48.super_EmitInfoBase.location)) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_48 & 0xffffffff);
      }
      else {
        pAVar1 = this->mFunction;
        TVar4 = WAsmJs::FromPrimitiveType<int>();
        pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&pAVar1->mTypedRegisterAllocator,TVar4);
        if ((local_38.super_EmitInfoBase.location != 0xffffffff) &&
           (local_38.super_EmitInfoBase.location < pRVar7->mRegisterCount)) {
          this_00 = &this->mWriter;
          ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pnode,0);
          local_40 = (EmitExpressionInfo)((ulong)CONCAT14(op == Shr_UInt,0xffffffff) | 0xa00000000);
          if (((byte)local_4c & op != And_Int) == 0) {
            R0.location = GetAndReleaseBinaryLocations<int>(this,&local_48,&local_38);
            AsmJsByteCodeWriter::AsmReg3
                      (this_00,op,R0.location,local_48.super_EmitInfoBase.location,
                       local_38.super_EmitInfoBase.location);
          }
          else {
            pAVar1 = this->mFunction;
            TVar4 = WAsmJs::FromPrimitiveType<int>();
            pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                               (&pAVar1->mTypedRegisterAllocator,TVar4);
            if (local_38.super_EmitInfoBase.location != 0xffffffff) {
              WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_38.super_EmitInfoBase.location)
              ;
            }
            R0.location = local_48.super_EmitInfoBase.location;
          }
          local_40.super_EmitInfoBase.location = R0.location;
          ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pnode);
          return local_40;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
      }
    }
    else {
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,
                 L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"
                );
    }
  }
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryInt( ParseNode * pnode, OpCodeAsmJs op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const bool isRhs0 = rhs->nop == knopInt && rhs->AsParseNodeInt()->lw == 0;
        const bool isOr0Operation = op == OpCodeAsmJs::Or_Int && isRhs0;
        if( isOr0Operation && lhs->nop == knopCall )
        {
            EmitExpressionInfo info = EmitCall(lhs, AsmJsRetType::Signed);
            if (!info.type.isIntish())
            {
                throw AsmJsCompilationException(_u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"));
            }
            info.type = AsmJsType::Signed;
            return info;
        }
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        if( !lType.isIntish() || !rType.isIntish() )
        {
            throw AsmJsCompilationException( _u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish") );
        }
        CheckNodeLocation( lhsEmit, int );
        CheckNodeLocation( rhsEmit, int );
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Signed );
        if( op == OpCodeAsmJs::Shr_UInt )
        {
            emitInfo.type = AsmJsType::Unsigned;
        }
        // ignore this specific operation, useful for non asm.js
        if( !isRhs0 || op == OpCodeAsmJs::And_Int )
        {
            RegSlot dstReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( op, dstReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dstReg;
        }
        else
        {
            mFunction->ReleaseLocation<int>( &rhsEmit );
            emitInfo.location = lhsEmit.location;
        }
        EndStatement(pnode);
        return emitInfo;
    }